

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

void runOnce<long,disruptor::MultiThreadedStrategyEx,disruptor::BlockingStrategy>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  rep rVar9;
  ulong uVar10;
  type diff;
  time_point end_time;
  int64_t cursor;
  int i_4;
  int i_3;
  int i_2;
  time_point start_time;
  thread *tp;
  int i_1;
  thread *tc;
  int i;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0> s;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> seqs;
  Sequence *sequences;
  memory_order __b_1;
  memory_order __b;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>
  *in_stack_fffffffffffffb78;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>
  *in_stack_fffffffffffffb80;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffb88;
  pointer *pppSVar11;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>
  *in_stack_fffffffffffffb90;
  size_t in_stack_fffffffffffffb98;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0> *pSVar12;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>
  *in_stack_fffffffffffffba0;
  ulong *puVar13;
  reference_wrapper<disruptor::Sequence> *in_stack_fffffffffffffba8;
  ulong *puVar14;
  reference_wrapper<disruptor::Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>_>
  *in_stack_fffffffffffffbb0;
  _func_void_Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>_ptr_Sequence_ptr
  *in_stack_fffffffffffffbb8;
  thread *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbd8;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0> *local_360;
  ulong *local_330;
  void *local_300;
  duration<long,_std::ratio<1L,_1000L>_> local_2d8;
  string local_2d0 [32];
  string local_2b0 [32];
  rep local_290;
  undefined8 local_288;
  int64_t local_280;
  int local_278;
  int local_274;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0> *local_270;
  int local_25c;
  undefined8 local_258;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0> *local_250;
  Sequence *local_248;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0> *local_240;
  int local_22c;
  ulong *local_228;
  void *local_220;
  int local_214;
  void *local_40;
  __atomic_base<long> local_38;
  memory_order local_30;
  undefined4 local_2c;
  atomic<long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<long> local_10;
  atomic<long> *local_8;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Staring run ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_8 = &sum;
  local_10._M_i = 0;
  local_14 = 5;
  local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_20 = local_10._M_i;
  if ((local_14 != 3) && (local_14 == 5)) {
    LOCK();
    UNLOCK();
  }
  sum.super___atomic_base<long>._M_i = (__atomic_base<long>)(__atomic_base<long>)local_10._M_i;
  uVar5 = (ulong)nc;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(0x78),0);
  if (SUB168(auVar1 * ZEXT816(0x78),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_40 = operator_new__(uVar6);
  if (uVar5 != 0) {
    local_300 = local_40;
    do {
      disruptor::Sequence::Sequence
                ((Sequence *)in_stack_fffffffffffffb80,(int64_t)in_stack_fffffffffffffb78);
      local_300 = (void *)((long)local_300 + 0x78);
    } while (local_300 != (void *)((long)local_40 + uVar5 * 0x78));
  }
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::vector
            ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)0x16b5d6);
  disruptor::Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>::
  Sequencer(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  for (local_214 = 0; local_214 < nc; local_214 = local_214 + 1) {
    local_220 = (void *)((long)local_40 + (long)local_214 * 0x78);
    std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::push_back
              ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
               in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
  }
  disruptor::Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>::
  set_gating_sequences
            (in_stack_fffffffffffffb80,
             (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             in_stack_fffffffffffffb78);
  uVar5 = (ulong)nc;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  uVar10 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar10 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  local_228 = (ulong *)operator_new__(uVar10);
  *local_228 = uVar5;
  local_228 = local_228 + 1;
  if (uVar5 != 0) {
    local_330 = local_228;
    do {
      std::thread::thread((thread *)0x16b769);
      local_330 = local_330 + 1;
    } while (local_330 != local_228 + uVar5);
  }
  for (local_22c = 0; local_22c < nc; local_22c = local_22c + 1) {
    local_240 = (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>
                 *)std::
                   ref<disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::BlockingStrategy,0>>
                             (in_stack_fffffffffffffb78);
    local_248 = (Sequence *)std::ref<disruptor::Sequence>((Sequence *)in_stack_fffffffffffffb78);
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::BlockingStrategy,0>&,disruptor::Sequence&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::BlockingStrategy,0>>,std::reference_wrapper<disruptor::Sequence>,void>
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
               in_stack_fffffffffffffba8);
    std::thread::operator=((thread *)in_stack_fffffffffffffb80,(thread *)in_stack_fffffffffffffb78);
    std::thread::~thread((thread *)0x16b848);
  }
  uVar5 = (ulong)np;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar5;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  uVar10 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar10 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar7 = (ulong *)operator_new__(uVar10);
  *puVar7 = uVar5;
  local_250 = (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0> *
              )(puVar7 + 1);
  if (uVar5 != 0) {
    local_360 = local_250;
    do {
      std::thread::thread((thread *)0x16b903);
      local_360 = (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>
                   *)&(local_360->ring_buffer_).events_;
    } while (local_360 !=
             (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0> *)
             ((local_250->cursor_).padding0_ + (uVar5 - 4)));
  }
  local_258 = std::chrono::_V2::system_clock::now();
  for (local_25c = 0; local_25c < np; local_25c = local_25c + 1) {
    local_270 = (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>
                 *)std::
                   ref<disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::BlockingStrategy,0>>
                             (in_stack_fffffffffffffb78);
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::BlockingStrategy,0>&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::BlockingStrategy,0>>,void>
              (in_stack_fffffffffffffbc0,
               (_func_void_Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>_ptr
                *)in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    std::thread::operator=((thread *)in_stack_fffffffffffffb80,(thread *)in_stack_fffffffffffffb78);
    std::thread::~thread((thread *)0x16b9bf);
  }
  for (local_274 = 0; local_274 < np; local_274 = local_274 + 1) {
    std::thread::join();
  }
  for (local_278 = 0; local_278 < nc; local_278 = local_278 + 1) {
    std::thread::join();
  }
  local_280 = disruptor::
              Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>::
              GetCursor((Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>
                         *)0x16ba76);
  poVar4 = std::operator<<((ostream *)&std::cout,"\nBatch size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,delta);
  poVar4 = std::operator<<(poVar4," Ring buffer size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,RING_BUFFER_SIZE);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Cursor: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_280);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Sum: ");
  local_28 = &sum;
  local_2c = 5;
  local_30 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_38 = sum.super___atomic_base<long>._M_i;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)sum.super___atomic_base<long>._M_i);
  poVar4 = std::operator<<(poVar4," Expected sum: ");
  poVar4 = (ostream *)
           std::ostream::operator<<(poVar4,(expectedValue * (expectedValue + 1) * (long)nc) / 2);
  std::operator<<(poVar4,'\n');
  local_288 = std::chrono::_V2::system_clock::now();
  local_290 = (rep)std::chrono::operator-
                             (in_stack_fffffffffffffb88,
                              (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffffb80);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,np);
  poVar4 = std::operator<<(poVar4,"P-");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,nc);
  poVar4 = std::operator<<(poVar4,"C ");
  std::type_info::name((type_info *)&disruptor::MultiThreadedStrategyEx::typeinfo);
  demangle_abi_cxx11_(in_stack_fffffffffffffbd8);
  poVar4 = std::operator<<(poVar4,local_2b0);
  poVar4 = std::operator<<(poVar4," ");
  std::type_info::name((type_info *)&disruptor::BlockingStrategy::typeinfo);
  demangle_abi_cxx11_(in_stack_fffffffffffffbd8);
  poVar4 = std::operator<<(poVar4,local_2d0);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string(local_2d0);
  std::__cxx11::string::~string(local_2b0);
  lVar8 = local_280 * 1000;
  local_2d8.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffb78);
  rVar9 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_2d8);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,lVar8 / rVar9);
  poVar4 = std::operator<<(poVar4," ops/secs");
  std::operator<<(poVar4,"\n\n");
  if (local_228 != (ulong *)0x0) {
    puVar14 = local_228 + -1;
    puVar13 = local_228 + local_228[-1];
    puVar7 = local_228;
    if (local_228 != puVar13) {
      do {
        puVar13 = puVar13 + -1;
        std::thread::~thread((thread *)0x16bf1b);
      } while (puVar13 != puVar7);
    }
    operator_delete__(puVar14);
  }
  if (local_250 !=
      (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0> *)0x0) {
    pppSVar11 = &local_250[-1].gating_sequences_.
                 super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    in_stack_fffffffffffffb90 =
         (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0> *)
         ((local_250->cursor_).padding0_ +
         (long)local_250[-1].gating_sequences_.
               super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + -4);
    pSVar12 = local_250;
    if (local_250 != in_stack_fffffffffffffb90) {
      do {
        in_stack_fffffffffffffb80 =
             (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0> *)
             &in_stack_fffffffffffffb90[-1].gating_sequences_.
              super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::thread::~thread((thread *)0x16bf88);
        in_stack_fffffffffffffb90 = in_stack_fffffffffffffb80;
      } while (in_stack_fffffffffffffb80 != pSVar12);
    }
    operator_delete__(pppSVar11);
  }
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
  }
  disruptor::Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>::
  ~Sequencer(in_stack_fffffffffffffb80);
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~vector
            ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             in_stack_fffffffffffffb90);
  return;
}

Assistant:

void runOnce() {
  std::cout << "Staring run " << std::endl;

  sum.store(0);

  disruptor::Sequence* sequences = new disruptor::Sequence[nc];

  std::vector<disruptor::Sequence*> seqs;
  disruptor::Sequencer<T, C, W> s(RING_BUFFER_SIZE);

  for (int i = 0; i < nc; ++i) seqs.push_back(&sequences[i]);

  s.set_gating_sequences(seqs);

  std::thread* tc = new std::thread[nc];
  for (int i = 0; i < nc; ++i)
    tc[i] = std::thread(consume<T, C, W>, std::ref(s), std::ref(sequences[i]));

  std::thread* tp = new std::thread[np];

  auto start_time = std::chrono::high_resolution_clock::now();

  for (int i = 0; i < np; ++i)
    tp[i] = std::thread(produce<T, C, W>, std::ref(s));

  // std::this_thread::sleep_for(std::chrono::seconds(3));

  for (int i = 0; i < np; ++i) tp[i].join();
  for (int i = 0; i < nc; ++i) tc[i].join();

  int64_t cursor = s.GetCursor();
  std::cout << "\nBatch size: " << delta
            << " Ring buffer size: " << RING_BUFFER_SIZE << '\n';
  std::cout << "Cursor: " << cursor << '\n';
  std::cout << "Sum: " << sum.load() << " Expected sum: "
            << (expectedValue * (expectedValue + 1) * nc) / 2 << '\n';

  auto end_time = std::chrono::high_resolution_clock::now();
  auto diff = end_time - start_time;

  //std::cout.precision(15);
  std::cout << np << "P-" << nc << "C " << demangle(typeid(C).name()) << " "
            << demangle(typeid(W).name()) << '\n';
  std::cout << (cursor * 1000) /
                   (std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                        .count())
            << " ops/secs"
            << "\n\n";

  delete[] tc;
  delete[] tp;
  delete[] sequences;
}